

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O1

ImageHeaders core::image::load_png_file_headers(string *filename)

{
  FILE *__stream;
  FileException *this;
  int *piVar1;
  char *msg;
  undefined1 local_48 [8];
  ImageHeaders headers;
  png_structp png;
  png_infop png_info;
  
  __stream = fopen((filename->_M_dataplus)._M_p,"rb");
  if (__stream != (FILE *)0x0) {
    headers.channels = 0;
    headers.type = IMAGE_TYPE_UNKNOWN;
    png = (png_structp)0x0;
    anon_unknown_7::load_png_headers_intern
              ((FILE *)__stream,(ImageHeaders *)local_48,(png_structp *)&headers.channels,
               (png_infop *)&png);
    png_destroy_read_struct(&headers.channels,&png,0);
    fclose(__stream);
    return _local_48;
  }
  this = (FileException *)__cxa_allocate_exception(0x48);
  piVar1 = __errno_location();
  msg = strerror(*piVar1);
  util::FileException::FileException(this,filename,msg);
  __cxa_throw(this,&util::FileException::typeinfo,util::FileException::~FileException);
}

Assistant:

ImageHeaders
load_png_file_headers (std::string const& filename)
{
    FILE* fp = std::fopen(filename.c_str(), "rb");
    if (fp == nullptr)
        throw util::FileException(filename, std::strerror(errno));

    /* Read PNG header info. */
    ImageHeaders headers;
    png_structp png = nullptr;
    png_infop png_info = nullptr;
    load_png_headers_intern(fp, &headers, &png, &png_info);

    /* Clean up. */
    png_destroy_read_struct(&png, &png_info, nullptr);
    std::fclose(fp);

    return headers;
}